

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterStartPI(xmlTextWriterPtr writer,xmlChar *target)

{
  int iVar1;
  int iVar2;
  xmlLinkPtr lk_00;
  void *pvVar3;
  long *data;
  xmlChar *pxVar4;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int sum;
  int count;
  xmlChar *target_local;
  xmlTextWriterPtr writer_local;
  
  if (((writer == (xmlTextWriterPtr)0x0) || (target == (xmlChar *)0x0)) || (*target == '\0')) {
    return -1;
  }
  iVar1 = xmlStrcasecmp(target,"xml");
  if (iVar1 == 0) {
    xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,
                    "xmlTextWriterStartPI : target name [Xx][Mm][Ll] is reserved for xml standardization!\n"
                   );
    return -1;
  }
  lk._0_4_ = 0;
  lk_00 = xmlListFront(writer->nodes);
  if ((lk_00 == (xmlLinkPtr)0x0) || (pvVar3 = xmlLinkGetData(lk_00), pvVar3 == (void *)0x0))
  goto LAB_00243faf;
  switch(*(undefined4 *)((long)pvVar3 + 8)) {
  case 0:
  case 3:
  case 7:
    goto LAB_00243faf;
  case 2:
    lk._0_4_ = xmlTextWriterEndAttribute(writer);
    if ((int)lk < 0) {
      return -1;
    }
  case 1:
    iVar1 = xmlTextWriterOutputNSDecl(writer);
    if (iVar1 < 0) {
      writer_local._4_4_ = -1;
    }
    else {
      iVar2 = xmlOutputBufferWriteString(writer->out,">");
      if (iVar2 < 0) {
        writer_local._4_4_ = -1;
      }
      else {
        lk._0_4_ = iVar2 + iVar1 + (int)lk;
        *(undefined4 *)((long)pvVar3 + 8) = 3;
LAB_00243faf:
        data = (long *)(*xmlMalloc)(0x10);
        if (data == (long *)0x0) {
          xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartPI : out of memory!\n");
          writer_local._4_4_ = -1;
        }
        else {
          pxVar4 = xmlStrdup(target);
          *data = (long)pxVar4;
          if (*data == 0) {
            xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartPI : out of memory!\n");
            (*xmlFree)(data);
            writer_local._4_4_ = -1;
          }
          else {
            *(undefined4 *)(data + 1) = 4;
            xmlListPushFront(writer->nodes,data);
            iVar1 = xmlOutputBufferWriteString(writer->out,"<?");
            if (iVar1 < 0) {
              writer_local._4_4_ = -1;
            }
            else {
              iVar2 = xmlOutputBufferWriteString(writer->out,(char *)*data);
              if (iVar2 < 0) {
                writer_local._4_4_ = -1;
              }
              else {
                writer_local._4_4_ = iVar2 + iVar1 + (int)lk;
              }
            }
          }
        }
      }
    }
    break;
  case 4:
  case 5:
    xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,"xmlTextWriterStartPI : nested PI!\n");
    writer_local._4_4_ = -1;
    break;
  default:
    writer_local._4_4_ = -1;
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterStartPI(xmlTextWriterPtr writer, const xmlChar * target)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if ((writer == NULL) || (target == NULL) || (*target == '\0'))
        return -1;

    if (xmlStrcasecmp(target, (const xmlChar *) "xml") == 0) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterStartPI : target name [Xx][Mm][Ll] is reserved for xml standardization!\n");
        return -1;
    }

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p != 0) {
            switch (p->state) {
                case XML_TEXTWRITER_ATTRIBUTE:
                    count = xmlTextWriterEndAttribute(writer);
                    if (count < 0)
                        return -1;
                    sum += count;
                    /* fallthrough */
                case XML_TEXTWRITER_NAME:
                    /* Output namespace declarations */
                    count = xmlTextWriterOutputNSDecl(writer);
                    if (count < 0)
                        return -1;
                    sum += count;
                    count = xmlOutputBufferWriteString(writer->out, ">");
                    if (count < 0)
                        return -1;
                    sum += count;
                    p->state = XML_TEXTWRITER_TEXT;
                    break;
                case XML_TEXTWRITER_NONE:
                case XML_TEXTWRITER_TEXT:
                case XML_TEXTWRITER_DTD:
                    break;
                case XML_TEXTWRITER_PI:
                case XML_TEXTWRITER_PI_TEXT:
                    xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                                    "xmlTextWriterStartPI : nested PI!\n");
                    return -1;
                default:
                    return -1;
            }
        }
    }

    p = (xmlTextWriterStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterStackEntry));
    if (p == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartPI : out of memory!\n");
        return -1;
    }

    p->name = xmlStrdup(target);
    if (p->name == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartPI : out of memory!\n");
        xmlFree(p);
        return -1;
    }
    p->state = XML_TEXTWRITER_PI;

    xmlListPushFront(writer->nodes, p);

    count = xmlOutputBufferWriteString(writer->out, "<?");
    if (count < 0)
        return -1;
    sum += count;
    count =
        xmlOutputBufferWriteString(writer->out, (const char *) p->name);
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}